

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void rollback_ncommits(void)

{
  fdb_encryption_key *fconfig_00;
  void *pvVar1;
  fdb_doc *doc;
  undefined8 uVar2;
  fdb_status fVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  fdb_kvs_handle *handle;
  int iVar7;
  ulong uVar8;
  fdb_kvs_handle *pfVar9;
  uint uVar10;
  fdb_kvs_handle *doc_00;
  char *pcVar11;
  long lVar12;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *pfVar14;
  fdb_seqnum_t seqnum;
  fdb_kvs_handle *config;
  fdb_kvs_config *config_00;
  char *pcVar15;
  fdb_kvs_handle *kv1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *kv2;
  fdb_kvs_info info;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char keybuf [256];
  fdb_iterator *pfStack_d98;
  fdb_doc *pfStack_d90;
  fdb_kvs_handle *pfStack_d88;
  timeval tStack_d80;
  char acStack_d70 [256];
  char acStack_c70 [264];
  fdb_kvs_handle *pfStack_b68;
  fdb_kvs_handle *pfStack_b60;
  fdb_kvs_handle *pfStack_b58;
  fdb_kvs_config *pfStack_b50;
  fdb_kvs_handle *pfStack_b48;
  fdb_kvs_handle *pfStack_b40;
  fdb_kvs_handle *pfStack_b30;
  fdb_custom_cmp_variable p_Stack_b28;
  fdb_kvs_handle *pfStack_b20;
  fdb_kvs_handle *pfStack_b18;
  fdb_kvs_handle *pfStack_b10;
  kvs_ops_stat *pkStack_b08;
  hbtrie *phStack_b00;
  hbtrie *phStack_af8;
  fdb_kvs_config fStack_af0;
  timeval tStack_ad8;
  undefined1 auStack_ac8 [512];
  fdb_config fStack_8c8;
  fdb_kvs_handle *pfStack_7d0;
  fdb_kvs_handle *pfStack_7c8;
  fdb_kvs_handle *pfStack_7c0;
  fdb_kvs_handle *pfStack_7b8;
  fdb_kvs_handle *pfStack_7b0;
  fdb_kvs_handle *pfStack_7a8;
  undefined1 auStack_790 [16];
  fdb_kvs_handle *pfStack_780;
  fdb_file_handle *pfStack_778;
  undefined1 auStack_770 [40];
  undefined1 auStack_748 [280];
  undefined1 auStack_630 [336];
  timeval tStack_4e0;
  fdb_kvs_handle fStack_4d0;
  fdb_kvs_handle *pfStack_2c8;
  fdb_seqnum_t fStack_2c0;
  undefined1 *puStack_2b8;
  fdb_kvs_handle *pfStack_2b0;
  undefined1 local_2a0 [24];
  undefined1 local_288 [64];
  fdb_kvs_config local_248;
  fdb_config local_230;
  char local_138 [264];
  
  pfStack_2b0 = (fdb_kvs_handle *)0x116bef;
  gettimeofday((timeval *)(local_288 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_2b0 = (fdb_kvs_handle *)0x116bf4;
  memleak_start();
  pfStack_2b0 = (fdb_kvs_handle *)0x116c01;
  fdb_get_default_config();
  pfStack_2b0 = (fdb_kvs_handle *)0x116c0e;
  fdb_get_default_kvs_config();
  pfStack_2b0 = (fdb_kvs_handle *)0x116c1a;
  system("rm -rf  mvcc_test* > errorlog.txt");
  local_230.wal_threshold = 0x400;
  local_230.flags = 1;
  local_230.compaction_threshold = '\0';
  local_230.block_reusing_threshold = 0;
  pfStack_2b0 = (fdb_kvs_handle *)0x116c51;
  fdb_open((fdb_file_handle **)(local_2a0 + 8),"./mvcc_test1",&local_230);
  pfStack_2b0 = (fdb_kvs_handle *)0x116c68;
  fdb_kvs_open((fdb_file_handle *)local_2a0._8_8_,(fdb_kvs_handle **)local_2a0,"kv1",&local_248);
  pfStack_2b0 = (fdb_kvs_handle *)0x116c7a;
  fdb_kvs_open((fdb_file_handle *)local_2a0._8_8_,(fdb_kvs_handle **)(local_2a0 + 0x10),(char *)0x0,
               &local_248);
  uVar8 = 0;
  do {
    iVar7 = 0;
    do {
      pfStack_2b0 = (fdb_kvs_handle *)0x116ca3;
      sprintf(local_138,"key%02d%03d",uVar8);
      uVar2 = local_2a0._0_8_;
      pfStack_2b0 = (fdb_kvs_handle *)0x116cb0;
      sVar4 = strlen(local_138);
      pfStack_2b0 = (fdb_kvs_handle *)0x116cc3;
      fdb_set_kv((fdb_kvs_handle *)uVar2,local_138,sVar4,(void *)0x0,0);
      uVar2 = local_2a0._16_8_;
      pfStack_2b0 = (fdb_kvs_handle *)0x116cd0;
      sVar4 = strlen(local_138);
      pfStack_2b0 = (fdb_kvs_handle *)0x116ce3;
      fdb_set_kv((fdb_kvs_handle *)uVar2,local_138,sVar4,(void *)0x0,0);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 100);
    pfStack_2b0 = (fdb_kvs_handle *)0x116cf9;
    fdb_commit((fdb_file_handle *)local_2a0._8_8_,(byte)uVar8 & 1);
    pfStack_2b0 = (fdb_kvs_handle *)0x116d06;
    fdb_get_kvs_info((fdb_kvs_handle *)local_2a0._0_8_,(fdb_kvs_info *)local_288);
    if (local_288._16_8_ != local_288._8_8_) {
      pfStack_2b0 = (fdb_kvs_handle *)0x116d2e;
      rollback_ncommits();
    }
    uVar10 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar10;
  } while (uVar10 != 10);
  doc_00 = (fdb_kvs_handle *)0xb;
  seqnum = 1000;
  pfVar13 = (fdb_kvs_handle *)local_2a0;
  pfVar14 = (fdb_kvs_handle *)local_288;
  while( true ) {
    pfStack_2b0 = (fdb_kvs_handle *)0x116d5a;
    fVar3 = fdb_rollback((fdb_kvs_handle **)pfVar13,seqnum);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pfStack_2b0 = (fdb_kvs_handle *)0x116d6f;
    fdb_get_kvs_info((fdb_kvs_handle *)local_2a0._0_8_,(fdb_kvs_info *)pfVar14);
    if (local_288._16_8_ != local_288._8_8_) {
      pfStack_2b0 = (fdb_kvs_handle *)0x116d95;
      rollback_ncommits();
    }
    doc_00 = (fdb_kvs_handle *)((long)&doc_00[-1].bub_ctx.handle + 7);
    seqnum = seqnum - 100;
    if (doc_00 < (fdb_kvs_handle *)0x2) {
      pfStack_2b0 = (fdb_kvs_handle *)0x116da1;
      fdb_kvs_close((fdb_kvs_handle *)local_2a0._0_8_);
      pfStack_2b0 = (fdb_kvs_handle *)0x116dab;
      fdb_close((fdb_file_handle *)local_2a0._8_8_);
      pfStack_2b0 = (fdb_kvs_handle *)0x116db0;
      fdb_shutdown();
      pfStack_2b0 = (fdb_kvs_handle *)0x116db5;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (rollback_ncommits()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pfStack_2b0 = (fdb_kvs_handle *)0x116de6;
      fprintf(_stderr,pcVar11,"rollback n commits");
      return;
    }
  }
  pfStack_2b0 = (fdb_kvs_handle *)transaction_test;
  rollback_ncommits();
  pfStack_7a8 = (fdb_kvs_handle *)0x116e1d;
  fStack_4d0.bub_ctx.space_used = (uint64_t)(local_288 + 0x10);
  fStack_4d0.bub_ctx.handle = pfVar13;
  pfStack_2c8 = pfVar14;
  fStack_2c0 = seqnum;
  puStack_2b8 = local_288 + 8;
  pfStack_2b0 = doc_00;
  gettimeofday(&tStack_4e0,(__timezone_ptr_t)0x0);
  pfStack_7a8 = (fdb_kvs_handle *)0x116e22;
  memleak_start();
  pfStack_7a8 = (fdb_kvs_handle *)0x116e2e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_7a8 = (fdb_kvs_handle *)0x116e3e;
  fdb_get_default_config();
  config = (fdb_kvs_handle *)auStack_748;
  pfStack_7a8 = (fdb_kvs_handle *)0x116e4b;
  fdb_get_default_kvs_config();
  fStack_4d0.config.encryption_key.bytes[4] = '\0';
  fStack_4d0.config.encryption_key.bytes[5] = '\0';
  fStack_4d0.config.encryption_key.bytes[6] = '\0';
  fStack_4d0.config.encryption_key.bytes[7] = '\0';
  fStack_4d0.config.encryption_key.bytes[8] = '\0';
  fStack_4d0.config.encryption_key.bytes[9] = '\0';
  fStack_4d0.config.encryption_key.bytes[10] = '\0';
  fStack_4d0.config.encryption_key.bytes[0xb] = '\0';
  fStack_4d0.config.encryption_key.bytes[0xc] = '\0';
  fStack_4d0.config.encryption_key.bytes[0xd] = '\x04';
  fStack_4d0.config.encryption_key.bytes[0xe] = '\0';
  fStack_4d0.config.encryption_key.bytes[0xf] = '\0';
  fStack_4d0.config.encryption_key.bytes[0x10] = '\0';
  fStack_4d0.config.encryption_key.bytes[0x11] = '\0';
  fStack_4d0.config.encryption_key.bytes[0x12] = '\0';
  fStack_4d0.config.encryption_key.bytes[0x13] = '\0';
  fStack_4d0.config._180_4_ = 1;
  fStack_4d0.config.encryption_key.bytes[0x18] = '\0';
  fStack_4d0.config.encryption_key.bytes[0x19] = '\0';
  fStack_4d0.config.encryption_key.bytes[0x1a] = '\0';
  fStack_4d0.config.encryption_key.bytes[0x1b] = '\0';
  fStack_4d0.config.block_reusing_threshold._7_1_ = 0;
  pfVar9 = (fdb_kvs_handle *)auStack_770;
  pfStack_7a8 = (fdb_kvs_handle *)0x116e84;
  fdb_open((fdb_file_handle **)pfVar9,"mvcc_test1",(fdb_config *)&fStack_4d0.config.encryption_key);
  pcVar11 = auStack_790 + 8;
  pfStack_7a8 = (fdb_kvs_handle *)0x116e97;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_770._0_8_,(fdb_kvs_handle **)pcVar11,
             (fdb_kvs_config *)config);
  pfStack_7a8 = (fdb_kvs_handle *)0x116ead;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_790._8_8_,logCallbackFunc,"transaction_test");
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e41;
  fconfig_00 = &fStack_4d0.config.encryption_key;
  pfStack_7a8 = (fdb_kvs_handle *)0x116ed7;
  fdb_open(&pfStack_778,"mvcc_test1",(fdb_config *)fconfig_00);
  pfStack_7a8 = (fdb_kvs_handle *)0x116eea;
  fdb_open((fdb_file_handle **)(auStack_770 + 0x10),"mvcc_test1",(fdb_config *)fconfig_00);
  pfStack_7a8 = (fdb_kvs_handle *)0x116eff;
  fdb_kvs_open_default(pfStack_778,&pfStack_780,(fdb_kvs_config *)auStack_748);
  pfStack_7a8 = (fdb_kvs_handle *)0x116f10;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_770._16_8_,(fdb_kvs_handle **)(auStack_770 + 8),
             (fdb_kvs_config *)auStack_748);
  pfStack_7a8 = (fdb_kvs_handle *)0x116f1d;
  fdb_begin_transaction(pfStack_778,'\x02');
  pfStack_7a8 = (fdb_kvs_handle *)0x116f2b;
  fdb_begin_transaction((fdb_file_handle *)auStack_770._16_8_,'\x02');
  lVar12 = 0;
  uVar8 = 0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x116f4b;
    sprintf(auStack_630 + 0x50,"key%d",uVar8 & 0xffffffff);
    pfStack_7a8 = (fdb_kvs_handle *)0x116f63;
    sprintf((char *)&fStack_4d0,"meta%d",uVar8 & 0xffffffff);
    pfStack_7a8 = (fdb_kvs_handle *)0x116f78;
    sprintf(auStack_748 + 0x18,"body%d",uVar8 & 0xffffffff);
    pfStack_7a8 = (fdb_kvs_handle *)0x116f8b;
    sVar4 = strlen(auStack_630 + 0x50);
    pfStack_7a8 = (fdb_kvs_handle *)0x116f9e;
    sVar5 = strlen((char *)&fStack_4d0);
    pfStack_7a8 = (fdb_kvs_handle *)0x116fab;
    sVar6 = strlen(auStack_748 + 0x18);
    pfStack_7a8 = (fdb_kvs_handle *)0x116fcd;
    fdb_doc_create((fdb_doc **)(auStack_630 + lVar12),auStack_630 + 0x50,sVar4,&fStack_4d0,sVar5,
                   auStack_748 + 0x18,sVar6);
    pfStack_7a8 = (fdb_kvs_handle *)0x116fdf;
    fdb_set(pfStack_780,*(fdb_doc **)(auStack_630 + uVar8 * 8));
    uVar8 = uVar8 + 1;
    lVar12 = lVar12 + 8;
  } while (uVar8 != 5);
  uVar8 = 5;
  pfVar14 = (fdb_kvs_handle *)0x28;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x117016;
    sprintf(auStack_630 + 0x50,"key%d",uVar8 & 0xffffffff);
    pfStack_7a8 = (fdb_kvs_handle *)0x11702e;
    sprintf((char *)&fStack_4d0,"meta%d",uVar8 & 0xffffffff);
    pfStack_7a8 = (fdb_kvs_handle *)0x117043;
    sprintf(auStack_748 + 0x18,"body%d",uVar8 & 0xffffffff);
    pfVar13 = (fdb_kvs_handle *)(auStack_630 + (long)pfVar14);
    pfStack_7a8 = (fdb_kvs_handle *)0x117056;
    sVar4 = strlen(auStack_630 + 0x50);
    pfStack_7a8 = (fdb_kvs_handle *)0x117069;
    sVar5 = strlen((char *)&fStack_4d0);
    pfStack_7a8 = (fdb_kvs_handle *)0x117076;
    sVar6 = strlen(auStack_748 + 0x18);
    pfStack_7a8 = (fdb_kvs_handle *)0x117098;
    fdb_doc_create((fdb_doc **)pfVar13,auStack_630 + 0x50,sVar4,&fStack_4d0,sVar5,auStack_748 + 0x18
                   ,sVar6);
    pfStack_7a8 = (fdb_kvs_handle *)0x1170aa;
    fdb_set((fdb_kvs_handle *)auStack_770._8_8_,*(fdb_doc **)(auStack_630 + uVar8 * 8));
    uVar8 = uVar8 + 1;
    pfVar14 = (fdb_kvs_handle *)((long)pfVar14 + 8);
  } while (uVar8 != 10);
  pcVar11 = "key%d";
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_790;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x1170e0;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x1170e8;
    sVar4 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x117106;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x117115;
    fVar3 = fdb_get(pfStack_780,(fdb_doc *)auStack_790._0_8_);
    if ((uint)doc_00 < 5) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e23;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00117e28;
    pfStack_7a8 = (fdb_kvs_handle *)0x117135;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    uVar10 = (uint)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_7a8 = (fdb_kvs_handle *)0x117158;
  fdb_open((fdb_file_handle **)(auStack_770 + 0x18),"mvcc_test1",
           (fdb_config *)&fStack_4d0.config.encryption_key);
  pfStack_7a8 = (fdb_kvs_handle *)0x11716a;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_770._24_8_,(fdb_kvs_handle **)(auStack_770 + 0x20),
             (fdb_kvs_config *)auStack_748);
  pfStack_7a8 = (fdb_kvs_handle *)0x117177;
  fdb_begin_transaction((fdb_file_handle *)auStack_770._24_8_,'\x03');
  pcVar11 = auStack_630 + 0x50;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x11719c;
    sprintf(pcVar11,"key%d",doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x1171a4;
    sVar4 = strlen(pcVar11);
    pfStack_7a8 = (fdb_kvs_handle *)0x1171c2;
    fdb_doc_create((fdb_doc **)auStack_790,pcVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x1171d1;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_770._32_8_,(fdb_doc *)auStack_790._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pfStack_7a8 = (fdb_kvs_handle *)0x117d8b;
      transaction_test();
      goto LAB_00117d8b;
    }
    pfStack_7a8 = (fdb_kvs_handle *)0x1171e3;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    uVar10 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_7a8 = (fdb_kvs_handle *)0x1171f6;
  fdb_end_transaction((fdb_file_handle *)auStack_770._24_8_,'\0');
  pfStack_7a8 = (fdb_kvs_handle *)0x117200;
  fdb_close((fdb_file_handle *)auStack_770._24_8_);
  pfStack_7a8 = (fdb_kvs_handle *)0x11720c;
  fdb_end_transaction(pfStack_778,'\0');
  pcVar11 = "key%d";
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_790;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x117231;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x117239;
    sVar4 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x117257;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x117266;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
    if ((uint)doc_00 < 5) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e2d;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00117e32;
    pfStack_7a8 = (fdb_kvs_handle *)0x117286;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    uVar10 = (uint)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_790;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x1172b2;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x1172ba;
    sVar4 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x1172d8;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x1172e7;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_770._8_8_,(fdb_doc *)auStack_790._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117d8b;
    pfStack_7a8 = (fdb_kvs_handle *)0x1172f9;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    uVar10 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_7a8 = (fdb_kvs_handle *)0x11730a;
  fdb_abort_transaction((fdb_file_handle *)auStack_770._16_8_);
  pfStack_7a8 = (fdb_kvs_handle *)0x117317;
  fdb_close((fdb_file_handle *)auStack_770._0_8_);
  pfStack_7a8 = (fdb_kvs_handle *)0x11732e;
  fdb_open((fdb_file_handle **)auStack_770,"mvcc_test1",
           (fdb_config *)&fStack_4d0.config.encryption_key);
  pcVar11 = auStack_790 + 8;
  pfStack_7a8 = (fdb_kvs_handle *)0x117343;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_770._0_8_,(fdb_kvs_handle **)pcVar11,
             (fdb_kvs_config *)auStack_748);
  pfStack_7a8 = (fdb_kvs_handle *)0x117359;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_790._8_8_,logCallbackFunc,"transaction_test");
  pcVar15 = (char *)pfVar13;
  handle = pfVar14;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e46;
  pcVar11 = "key%d";
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_790;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x117386;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x11738e;
    sVar4 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x1173ac;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x1173bb;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
    if ((uint)doc_00 < 5) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e37;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00117e3c;
    pfStack_7a8 = (fdb_kvs_handle *)0x1173db;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    uVar10 = (uint)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  lVar12 = 0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x1173f6;
    fdb_set((fdb_kvs_handle *)auStack_790._8_8_,*(fdb_doc **)(auStack_630 + lVar12 * 8 + 0x28));
    lVar12 = lVar12 + 1;
  } while (lVar12 != 5);
  pfStack_7a8 = (fdb_kvs_handle *)0x11740b;
  fdb_commit((fdb_file_handle *)auStack_770._0_8_,'\0');
  pcVar11 = auStack_630 + 0x50;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x117430;
    sprintf(pcVar11,"key%d",doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x117438;
    sVar4 = strlen(pcVar11);
    pfStack_7a8 = (fdb_kvs_handle *)0x117456;
    fdb_doc_create((fdb_doc **)auStack_790,pcVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x117465;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117d90;
    pfStack_7a8 = (fdb_kvs_handle *)0x117477;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    uVar10 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_7a8 = (fdb_kvs_handle *)0x11748d;
  fdb_begin_transaction(pfStack_778,'\x02');
  pfStack_7a8 = (fdb_kvs_handle *)0x11749c;
  fdb_begin_transaction((fdb_file_handle *)auStack_770._16_8_,'\x02');
  uVar8 = 0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x1174bb;
    sprintf(auStack_630 + 0x50,"key%d",uVar8);
    doc_00 = &fStack_4d0;
    pfStack_7a8 = (fdb_kvs_handle *)0x1174d7;
    sprintf((char *)doc_00,"meta%d",uVar8);
    pcVar15 = auStack_748 + 0x18;
    pfStack_7a8 = (fdb_kvs_handle *)0x1174f0;
    sprintf(pcVar15,"body%d_txn1",uVar8);
    pfStack_7a8 = (fdb_kvs_handle *)0x1174f8;
    sVar4 = strlen(auStack_630 + 0x50);
    pfStack_7a8 = (fdb_kvs_handle *)0x117503;
    sVar5 = strlen((char *)doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x11750e;
    sVar6 = strlen(pcVar15);
    pcVar11 = auStack_630 + 0x50;
    pfStack_7a8 = (fdb_kvs_handle *)0x117533;
    fdb_doc_create((fdb_doc **)auStack_790,pcVar11,sVar4,doc_00,sVar5,pcVar15,sVar6);
    pfStack_7a8 = (fdb_kvs_handle *)0x117542;
    fdb_set(pfStack_780,(fdb_doc *)auStack_790._0_8_);
    pfStack_7a8 = (fdb_kvs_handle *)0x11754c;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    pfStack_7a8 = (fdb_kvs_handle *)0x117560;
    sprintf(pcVar15,"body%d_txn2",uVar8);
    pfStack_7a8 = (fdb_kvs_handle *)0x117568;
    sVar4 = strlen(pcVar11);
    pfStack_7a8 = (fdb_kvs_handle *)0x117573;
    sVar5 = strlen((char *)doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x11757e;
    sVar6 = strlen(pcVar15);
    pfStack_7a8 = (fdb_kvs_handle *)0x11759b;
    fdb_doc_create((fdb_doc **)auStack_790,pcVar11,sVar4,doc_00,sVar5,pcVar15,sVar6);
    pfStack_7a8 = (fdb_kvs_handle *)0x1175aa;
    fdb_set((fdb_kvs_handle *)auStack_770._8_8_,(fdb_doc *)auStack_790._0_8_);
    pfStack_7a8 = (fdb_kvs_handle *)0x1175b4;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    uVar10 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar10;
  } while (uVar10 != 10);
  pfVar14 = (fdb_kvs_handle *)auStack_790;
  handle = (fdb_kvs_handle *)(auStack_748 + 0x18);
  pcVar11 = (char *)0x0;
  do {
    config = (fdb_kvs_handle *)(auStack_630 + 0x50);
    pfStack_7a8 = (fdb_kvs_handle *)0x1175e8;
    sprintf((char *)config,"key%d",(ulong)pcVar11 & 0xffffffff);
    pfStack_7a8 = (fdb_kvs_handle *)0x1175f0;
    sVar4 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x11760e;
    fdb_doc_create((fdb_doc **)pfVar14,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x11761d;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
    pfVar13 = (fdb_kvs_handle *)auStack_790._0_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117da0;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
    pfVar9 = *(fdb_kvs_handle **)(*(long *)(auStack_630 + (long)pcVar11 * 8) + 0x40);
    pfStack_7a8 = (fdb_kvs_handle *)0x117651;
    iVar7 = bcmp(doc_00,pfVar9,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
    config = handle;
    if (iVar7 != 0) goto LAB_00117d95;
    pfStack_7a8 = (fdb_kvs_handle *)0x117661;
    fdb_doc_free((fdb_doc *)pfVar13);
    pcVar15 = auStack_630 + 0x50;
    pfStack_7a8 = (fdb_kvs_handle *)0x117671;
    sVar4 = strlen(pcVar15);
    pfStack_7a8 = (fdb_kvs_handle *)0x117692;
    fdb_doc_create((fdb_doc **)pfVar14,pcVar15,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x1176a1;
    fVar3 = fdb_get(pfStack_780,(fdb_doc *)auStack_790._0_8_);
    pfVar13 = pfVar14;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117db2;
    pfStack_7a8 = (fdb_kvs_handle *)0x1176bf;
    sprintf((char *)handle,"body%d_txn1",(ulong)pcVar11 & 0xffffffff);
    pcVar15 = (char *)auStack_790._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
    pfStack_7a8 = (fdb_kvs_handle *)0x1176d9;
    iVar7 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
    if (iVar7 != 0) goto LAB_00117da5;
    pfStack_7a8 = (fdb_kvs_handle *)0x1176e9;
    fdb_doc_free((fdb_doc *)pcVar15);
    config = (fdb_kvs_handle *)(auStack_630 + 0x50);
    pfStack_7a8 = (fdb_kvs_handle *)0x1176f9;
    sVar4 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x117717;
    fdb_doc_create((fdb_doc **)pfVar14,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x117726;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_770._8_8_,(fdb_doc *)auStack_790._0_8_);
    pfVar9 = pfVar14;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117dc4;
    pfStack_7a8 = (fdb_kvs_handle *)0x117741;
    sprintf((char *)handle,"body%d_txn2",(ulong)pcVar11 & 0xffffffff);
    pcVar15 = (char *)auStack_790._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
    pfStack_7a8 = (fdb_kvs_handle *)0x11775b;
    iVar7 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
    if (iVar7 != 0) goto LAB_00117db7;
    pfStack_7a8 = (fdb_kvs_handle *)0x11776b;
    fdb_doc_free((fdb_doc *)pcVar15);
    pcVar11 = &(((fdb_kvs_handle *)pcVar11)->kvs_config).field_0x1;
  } while (pcVar11 != (undefined1 *)0xa);
  pfStack_7a8 = (fdb_kvs_handle *)0x117784;
  fdb_end_transaction((fdb_file_handle *)auStack_770._16_8_,'\0');
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_790;
  handle = (fdb_kvs_handle *)(auStack_748 + 0x18);
  pcVar11 = (char *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x1177ab;
    sprintf((char *)config,"key%d",pcVar11);
    pfStack_7a8 = (fdb_kvs_handle *)0x1177b3;
    sVar4 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x1177d1;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x1177e0;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117dd6;
    pfStack_7a8 = (fdb_kvs_handle *)0x1177fb;
    sprintf((char *)handle,"body%d_txn2",pcVar11);
    pcVar15 = (char *)auStack_790._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
    pfStack_7a8 = (fdb_kvs_handle *)0x117815;
    iVar7 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
    if (iVar7 != 0) goto LAB_00117dc9;
    pfStack_7a8 = (fdb_kvs_handle *)0x117825;
    fdb_doc_free((fdb_doc *)pcVar15);
    pfStack_7a8 = (fdb_kvs_handle *)0x11782d;
    sVar4 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x11784b;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x11785a;
    fVar3 = fdb_get(pfStack_780,(fdb_doc *)auStack_790._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117de8;
    pfStack_7a8 = (fdb_kvs_handle *)0x117875;
    sprintf((char *)handle,"body%d_txn1",pcVar11);
    pcVar15 = (char *)auStack_790._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
    pfStack_7a8 = (fdb_kvs_handle *)0x11788f;
    iVar7 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
    if (iVar7 != 0) goto LAB_00117ddb;
    pfStack_7a8 = (fdb_kvs_handle *)0x11789f;
    fdb_doc_free((fdb_doc *)pcVar15);
    uVar10 = (int)pcVar11 + 1;
    pcVar11 = (char *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_7a8 = (fdb_kvs_handle *)0x1178b6;
  fdb_end_transaction(pfStack_778,'\0');
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pcVar15 = "body%d_txn1";
  handle = (fdb_kvs_handle *)(auStack_748 + 0x18);
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x1178df;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x1178e7;
    sVar4 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x117907;
    fdb_doc_create((fdb_doc **)auStack_790,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x117916;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117dfa;
    pfStack_7a8 = (fdb_kvs_handle *)0x11792d;
    sprintf((char *)handle,"body%d_txn1",doc_00);
    pcVar11 = (char *)auStack_790._0_8_;
    pfVar9 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
    pfStack_7a8 = (fdb_kvs_handle *)0x117945;
    iVar7 = bcmp(pfVar9,handle,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
    if (iVar7 != 0) goto LAB_00117ded;
    pfStack_7a8 = (fdb_kvs_handle *)0x117955;
    fdb_doc_free((fdb_doc *)pcVar11);
    uVar10 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_7a8 = (fdb_kvs_handle *)0x11796f;
  fdb_begin_transaction(pfStack_778,'\x02');
  pfVar13 = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pfStack_7a8 = (fdb_kvs_handle *)0x11798d;
  sprintf((char *)pfVar13,"key%d",5);
  pfVar9 = &fStack_4d0;
  pfStack_7a8 = (fdb_kvs_handle *)0x1179ab;
  sprintf((char *)pfVar9,"meta%d",5);
  pcVar15 = auStack_748 + 0x18;
  pfStack_7a8 = (fdb_kvs_handle *)0x1179c6;
  sprintf(pcVar15,"body%d_before_compaction",5);
  pfStack_7a8 = (fdb_kvs_handle *)0x1179ce;
  handle = (fdb_kvs_handle *)strlen((char *)pfVar13);
  pfStack_7a8 = (fdb_kvs_handle *)0x1179d9;
  doc_00 = (fdb_kvs_handle *)strlen((char *)pfVar9);
  pfStack_7a8 = (fdb_kvs_handle *)0x1179e4;
  sVar4 = strlen(pcVar15);
  config = (fdb_kvs_handle *)auStack_790;
  pfStack_7a8 = (fdb_kvs_handle *)0x117a04;
  fdb_doc_create((fdb_doc **)config,pfVar13,(size_t)handle,pfVar9,(size_t)doc_00,pcVar15,sVar4);
  pfStack_7a8 = (fdb_kvs_handle *)0x117a11;
  fdb_set(pfStack_780,(fdb_doc *)auStack_790._0_8_);
  pfStack_7a8 = (fdb_kvs_handle *)0x117a19;
  fdb_doc_free((fdb_doc *)auStack_790._0_8_);
  pfStack_7a8 = (fdb_kvs_handle *)0x117a2a;
  fdb_compact((fdb_file_handle *)auStack_770._0_8_,"mvcc_test2");
  pfStack_7a8 = (fdb_kvs_handle *)0x117a32;
  sVar4 = strlen((char *)pfVar13);
  pfStack_7a8 = (fdb_kvs_handle *)0x117a50;
  fdb_doc_create((fdb_doc **)config,pfVar13,sVar4,(void *)0x0,0,(void *)0x0,0);
  pfStack_7a8 = (fdb_kvs_handle *)0x117a5d;
  fVar3 = fdb_get(pfStack_780,(fdb_doc *)auStack_790._0_8_);
  pcVar11 = (char *)auStack_790._0_8_;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e4b;
  config = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
  pfStack_7a8 = (fdb_kvs_handle *)0x117a7f;
  iVar7 = bcmp(config,auStack_748 + 0x18,
               (size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
  if (iVar7 != 0) goto LAB_00117e50;
  pfStack_7a8 = (fdb_kvs_handle *)0x117a8f;
  fdb_doc_free((fdb_doc *)pcVar11);
  pcVar11 = auStack_630 + 0x50;
  pfStack_7a8 = (fdb_kvs_handle *)0x117a9f;
  sVar4 = strlen(pcVar11);
  config = (fdb_kvs_handle *)auStack_790;
  pfStack_7a8 = (fdb_kvs_handle *)0x117ac2;
  fdb_doc_create((fdb_doc **)config,pcVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
  pfStack_7a8 = (fdb_kvs_handle *)0x117acf;
  fVar3 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e5d;
  pfVar9 = (fdb_kvs_handle *)(auStack_748 + 0x18);
  pfStack_7a8 = (fdb_kvs_handle *)0x117af2;
  sprintf((char *)pfVar9,"body%d_txn1",5);
  pcVar11 = (char *)auStack_790._0_8_;
  config = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
  pfStack_7a8 = (fdb_kvs_handle *)0x117b0a;
  iVar7 = bcmp(config,pfVar9,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
  if (iVar7 != 0) goto LAB_00117e62;
  pfStack_7a8 = (fdb_kvs_handle *)0x117b1a;
  fdb_doc_free((fdb_doc *)pcVar11);
  pfStack_7a8 = (fdb_kvs_handle *)0x117b26;
  fdb_end_transaction(pfStack_778,'\0');
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_790;
  handle = (fdb_kvs_handle *)(auStack_748 + 0x18);
  pcVar15 = (char *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x117b4f;
    sprintf((char *)config,"key%d",pcVar15);
    pfStack_7a8 = (fdb_kvs_handle *)0x117b57;
    sVar4 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x117b75;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x117b84;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e0c;
    if ((int)pcVar15 == 5) {
      pcVar11 = "body%d_before_compaction";
      pfVar13 = (fdb_kvs_handle *)0x5;
    }
    else {
      pcVar11 = "body%d_txn1";
      pfVar13 = (fdb_kvs_handle *)pcVar15;
    }
    pfStack_7a8 = (fdb_kvs_handle *)0x117bb4;
    sprintf((char *)handle,pcVar11,pfVar13);
    doc_00 = (fdb_kvs_handle *)auStack_790._0_8_;
    pcVar11 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))
                      ->seqtree;
    pfStack_7a8 = (fdb_kvs_handle *)0x117bcc;
    iVar7 = bcmp(pcVar11,handle,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
    if (iVar7 != 0) goto LAB_00117dff;
    pfStack_7a8 = (fdb_kvs_handle *)0x117bdc;
    fdb_doc_free((fdb_doc *)doc_00);
    uVar10 = (int)pcVar15 + 1;
    pcVar15 = (char *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_7a8 = (fdb_kvs_handle *)0x117bf6;
  fdb_close((fdb_file_handle *)auStack_770._0_8_);
  pfStack_7a8 = (fdb_kvs_handle *)0x117c0d;
  fdb_open((fdb_file_handle **)auStack_770,"mvcc_test2",
           (fdb_config *)&fStack_4d0.config.encryption_key);
  pcVar11 = auStack_790 + 8;
  pfStack_7a8 = (fdb_kvs_handle *)0x117c22;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_770._0_8_,(fdb_kvs_handle **)pcVar11,
             (fdb_kvs_config *)auStack_748);
  pfStack_7a8 = (fdb_kvs_handle *)0x117c38;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_790._8_8_,logCallbackFunc,"transaction_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    config = (fdb_kvs_handle *)(auStack_630 + 0x50);
    pfVar9 = (fdb_kvs_handle *)auStack_790;
    handle = (fdb_kvs_handle *)(auStack_748 + 0x18);
    pcVar15 = (char *)0x0;
    while( true ) {
      pfStack_7a8 = (fdb_kvs_handle *)0x117c69;
      sprintf((char *)config,"key%d",pcVar15);
      pfStack_7a8 = (fdb_kvs_handle *)0x117c71;
      sVar4 = strlen((char *)config);
      pfStack_7a8 = (fdb_kvs_handle *)0x117c8f;
      fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
      pfStack_7a8 = (fdb_kvs_handle *)0x117c9e;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
      if (fVar3 != FDB_RESULT_SUCCESS) break;
      if ((int)pcVar15 == 5) {
        pcVar11 = "body%d_before_compaction";
        pfVar13 = (fdb_kvs_handle *)0x5;
      }
      else {
        pcVar11 = "body%d_txn1";
        pfVar13 = (fdb_kvs_handle *)pcVar15;
      }
      pfStack_7a8 = (fdb_kvs_handle *)0x117cce;
      sprintf((char *)handle,pcVar11,pfVar13);
      doc_00 = (fdb_kvs_handle *)auStack_790._0_8_;
      pcVar11 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40)
                        )->seqtree;
      pfStack_7a8 = (fdb_kvs_handle *)0x117ce6;
      iVar7 = bcmp(pcVar11,handle,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
      if (iVar7 != 0) goto LAB_00117e11;
      pfStack_7a8 = (fdb_kvs_handle *)0x117cf6;
      fdb_doc_free((fdb_doc *)doc_00);
      uVar10 = (int)pcVar15 + 1;
      pcVar15 = (char *)(ulong)uVar10;
      if (uVar10 == 10) {
        pfStack_7a8 = (fdb_kvs_handle *)0x117d0d;
        fdb_close((fdb_file_handle *)auStack_770._0_8_);
        pfStack_7a8 = (fdb_kvs_handle *)0x117d17;
        fdb_close(pfStack_778);
        pfStack_7a8 = (fdb_kvs_handle *)0x117d21;
        fdb_close((fdb_file_handle *)auStack_770._16_8_);
        lVar12 = 0;
        do {
          pfStack_7a8 = (fdb_kvs_handle *)0x117d30;
          fdb_doc_free(*(fdb_doc **)(auStack_630 + lVar12 * 8));
          lVar12 = lVar12 + 1;
        } while (lVar12 != 10);
        pfStack_7a8 = (fdb_kvs_handle *)0x117d3e;
        fdb_shutdown();
        pfStack_7a8 = (fdb_kvs_handle *)0x117d43;
        memleak_end();
        pcVar11 = "%s PASSED\n";
        if (transaction_test()::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        pfStack_7a8 = (fdb_kvs_handle *)0x117d74;
        fprintf(_stderr,pcVar11,"transaction test");
        return;
      }
    }
    goto LAB_00117e1e;
  }
  goto LAB_00117e6f;
LAB_0011849b:
  pfStack_b40 = (fdb_kvs_handle *)0x1184a8;
  transaction_simple_api_test();
  pfVar14 = pfVar13;
LAB_001184a8:
  pfStack_b40 = (fdb_kvs_handle *)0x1184ad;
  transaction_simple_api_test();
LAB_001184ad:
  pfStack_b40 = (fdb_kvs_handle *)0x1184ba;
  transaction_simple_api_test();
  pfVar13 = pfVar14;
LAB_001184ba:
  pfStack_b40 = (fdb_kvs_handle *)0x1184bf;
  transaction_simple_api_test();
LAB_001184bf:
  pfStack_b40 = (fdb_kvs_handle *)0x1184cc;
  transaction_simple_api_test();
  pfVar9 = pfVar13;
LAB_001184cc:
  pfStack_b40 = (fdb_kvs_handle *)0x1184d1;
  transaction_simple_api_test();
LAB_001184d1:
  pfStack_b40 = (fdb_kvs_handle *)0x1184de;
  transaction_simple_api_test();
  pfVar13 = pfVar9;
LAB_001184de:
  pfVar9 = pfVar13;
  pfStack_b40 = (fdb_kvs_handle *)0x1184e3;
  transaction_simple_api_test();
LAB_001184e3:
  pfStack_b40 = (fdb_kvs_handle *)0x1184e8;
  transaction_simple_api_test();
LAB_001184e8:
  pfVar14 = pfVar9;
  pfStack_b40 = (fdb_kvs_handle *)0x1184ed;
  transaction_simple_api_test();
LAB_001184ed:
  pfStack_b40 = (fdb_kvs_handle *)0x1184fa;
  transaction_simple_api_test();
LAB_001184fa:
  pfVar9 = (fdb_kvs_handle *)auStack_ac8;
  pfStack_b40 = (fdb_kvs_handle *)0x118507;
  transaction_simple_api_test();
  pfVar13 = (fdb_kvs_handle *)pcVar15;
  goto LAB_00118507;
LAB_00117d8b:
  pfStack_7a8 = (fdb_kvs_handle *)0x117d90;
  transaction_test();
LAB_00117d90:
  pfVar9 = (fdb_kvs_handle *)auStack_790;
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pcVar11 = "key%d";
  pfStack_7a8 = (fdb_kvs_handle *)0x117d95;
  transaction_test();
LAB_00117d95:
  pfStack_7a8 = (fdb_kvs_handle *)0x117da0;
  transaction_test();
  pcVar15 = (char *)pfVar13;
  handle = pfVar14;
  pfVar14 = pfVar9;
LAB_00117da0:
  pfStack_7a8 = (fdb_kvs_handle *)0x117da5;
  transaction_test();
LAB_00117da5:
  pfStack_7a8 = (fdb_kvs_handle *)0x117db2;
  transaction_test();
  pfVar13 = handle;
LAB_00117db2:
  handle = pfVar13;
  pfStack_7a8 = (fdb_kvs_handle *)0x117db7;
  transaction_test();
  pfVar9 = pfVar14;
LAB_00117db7:
  pfStack_7a8 = (fdb_kvs_handle *)0x117dc4;
  transaction_test();
LAB_00117dc4:
  pfStack_7a8 = (fdb_kvs_handle *)0x117dc9;
  transaction_test();
LAB_00117dc9:
  pfStack_7a8 = (fdb_kvs_handle *)0x117dd6;
  transaction_test();
LAB_00117dd6:
  pfStack_7a8 = (fdb_kvs_handle *)0x117ddb;
  transaction_test();
LAB_00117ddb:
  pfStack_7a8 = (fdb_kvs_handle *)0x117de8;
  transaction_test();
LAB_00117de8:
  pfStack_7a8 = (fdb_kvs_handle *)0x117ded;
  transaction_test();
LAB_00117ded:
  pfStack_7a8 = (fdb_kvs_handle *)0x117dfa;
  transaction_test();
LAB_00117dfa:
  pfStack_7a8 = (fdb_kvs_handle *)0x117dff;
  transaction_test();
LAB_00117dff:
  pfStack_7a8 = (fdb_kvs_handle *)0x117e0c;
  transaction_test();
LAB_00117e0c:
  pfStack_7a8 = (fdb_kvs_handle *)0x117e11;
  transaction_test();
LAB_00117e11:
  pfStack_7a8 = (fdb_kvs_handle *)0x117e1e;
  transaction_test();
LAB_00117e1e:
  pfStack_7a8 = (fdb_kvs_handle *)0x117e23;
  transaction_test();
  pfVar13 = (fdb_kvs_handle *)pcVar15;
  pfVar14 = handle;
LAB_00117e23:
  pfStack_7a8 = (fdb_kvs_handle *)0x117e28;
  transaction_test();
LAB_00117e28:
  pfStack_7a8 = (fdb_kvs_handle *)0x117e2d;
  transaction_test();
LAB_00117e2d:
  pfStack_7a8 = (fdb_kvs_handle *)0x117e32;
  transaction_test();
LAB_00117e32:
  pfStack_7a8 = (fdb_kvs_handle *)0x117e37;
  transaction_test();
LAB_00117e37:
  pfStack_7a8 = (fdb_kvs_handle *)0x117e3c;
  transaction_test();
LAB_00117e3c:
  pfStack_7a8 = (fdb_kvs_handle *)0x117e41;
  transaction_test();
LAB_00117e41:
  pfStack_7a8 = (fdb_kvs_handle *)0x117e46;
  transaction_test();
  pcVar15 = (char *)pfVar13;
  handle = pfVar14;
LAB_00117e46:
  pfStack_7a8 = (fdb_kvs_handle *)0x117e4b;
  transaction_test();
  pfVar13 = (fdb_kvs_handle *)pcVar11;
LAB_00117e4b:
  pcVar11 = (char *)pfVar13;
  pfStack_7a8 = (fdb_kvs_handle *)0x117e50;
  transaction_test();
LAB_00117e50:
  pfStack_7a8 = (fdb_kvs_handle *)0x117e5d;
  transaction_test();
LAB_00117e5d:
  pfStack_7a8 = (fdb_kvs_handle *)0x117e62;
  transaction_test();
LAB_00117e62:
  pfStack_7a8 = (fdb_kvs_handle *)0x117e6f;
  transaction_test();
LAB_00117e6f:
  pfStack_7a8 = (fdb_kvs_handle *)transaction_simple_api_test;
  transaction_test();
  pfStack_b40 = (fdb_kvs_handle *)0x117e91;
  pfStack_7d0 = (fdb_kvs_handle *)pcVar11;
  pfStack_7c8 = (fdb_kvs_handle *)pcVar15;
  pfStack_7c0 = handle;
  pfStack_7b8 = config;
  pfStack_7b0 = pfVar9;
  pfStack_7a8 = doc_00;
  gettimeofday(&tStack_ad8,(__timezone_ptr_t)0x0);
  pfStack_b40 = (fdb_kvs_handle *)0x117e96;
  memleak_start();
  pfStack_b40 = (fdb_kvs_handle *)0x117ea2;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_b40 = (fdb_kvs_handle *)0x117eb2;
  fdb_get_default_config();
  config_00 = &fStack_af0;
  pfStack_b40 = (fdb_kvs_handle *)0x117ebf;
  fdb_get_default_kvs_config();
  fStack_8c8.buffercache_size = 0;
  fStack_8c8.wal_threshold = 0x400;
  fStack_8c8.flags = 1;
  fStack_8c8.purging_interval = 0;
  fStack_8c8.compaction_threshold = '\0';
  pfVar13 = (fdb_kvs_handle *)&phStack_af8;
  pfStack_b40 = (fdb_kvs_handle *)0x117ef8;
  fdb_open((fdb_file_handle **)pfVar13,"./mvcc_test1",&fStack_8c8);
  pfVar14 = (fdb_kvs_handle *)&pfStack_b20;
  pfStack_b40 = (fdb_kvs_handle *)0x117f0b;
  fdb_kvs_open_default((fdb_file_handle *)phStack_af8,(fdb_kvs_handle **)pfVar14,config_00);
  pfStack_b40 = (fdb_kvs_handle *)0x117f21;
  pfVar9 = pfStack_b20;
  fVar3 = fdb_set_log_callback(pfStack_b20,logCallbackFunc,"transaction_simple_api_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcVar11 = auStack_ac8 + 0x100;
    pcVar15 = "body%d";
    doc_00 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_b40 = (fdb_kvs_handle *)0x117f52;
      sprintf(pcVar11,"key%d",doc_00);
      pfStack_b40 = (fdb_kvs_handle *)0x117f61;
      sprintf(auStack_ac8,"body%d",doc_00);
      handle = pfStack_b20;
      pfStack_b40 = (fdb_kvs_handle *)0x117f6e;
      pfVar13 = (fdb_kvs_handle *)strlen(pcVar11);
      pfStack_b40 = (fdb_kvs_handle *)0x117f79;
      sVar4 = strlen(auStack_ac8);
      pfStack_b40 = (fdb_kvs_handle *)0x117f8d;
      fVar3 = fdb_set_kv(handle,pcVar11,(size_t)pfVar13,auStack_ac8,sVar4);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_b40 = (fdb_kvs_handle *)0x11849b;
        transaction_simple_api_test();
        goto LAB_0011849b;
      }
      uVar10 = (int)doc_00 + 1;
      doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
    } while (uVar10 != 10);
    pfStack_b40 = (fdb_kvs_handle *)0x117fa8;
    fdb_commit((fdb_file_handle *)phStack_af8,'\0');
    pfStack_b40 = (fdb_kvs_handle *)0x117fca;
    fdb_open((fdb_file_handle **)&phStack_b00,"./mvcc_test1",&fStack_8c8);
    pfStack_b40 = (fdb_kvs_handle *)0x117fdd;
    fdb_open((fdb_file_handle **)&pkStack_b08,"./mvcc_test1",&fStack_8c8);
    pfStack_b40 = (fdb_kvs_handle *)0x117ff2;
    fdb_kvs_open_default((fdb_file_handle *)phStack_b00,&pfStack_b10,&fStack_af0);
    pfStack_b40 = (fdb_kvs_handle *)0x118003;
    fdb_kvs_open_default((fdb_file_handle *)pkStack_b08,&pfStack_b18,&fStack_af0);
    pfStack_b40 = (fdb_kvs_handle *)0x118010;
    fdb_begin_transaction((fdb_file_handle *)phStack_b00,'\x02');
    pfStack_b40 = (fdb_kvs_handle *)0x11801e;
    fdb_begin_transaction((fdb_file_handle *)pkStack_b08,'\x02');
    pcVar11 = auStack_ac8 + 0x100;
    uVar10 = 0;
    do {
      pfStack_b40 = (fdb_kvs_handle *)0x118043;
      sprintf(pcVar11,"key%d",(ulong)uVar10);
      pfStack_b40 = (fdb_kvs_handle *)0x118056;
      sprintf(auStack_ac8,"body%d_txn1",(ulong)uVar10);
      pfVar13 = pfStack_b10;
      pfStack_b40 = (fdb_kvs_handle *)0x118063;
      sVar4 = strlen(pcVar11);
      pfStack_b40 = (fdb_kvs_handle *)0x11806e;
      sVar5 = strlen(auStack_ac8);
      pfStack_b40 = (fdb_kvs_handle *)0x118082;
      fdb_set_kv(pfVar13,pcVar11,sVar4,auStack_ac8,sVar5);
      pfStack_b40 = (fdb_kvs_handle *)0x118091;
      sprintf(pcVar11,"key%d",(ulong)uVar10);
      pfStack_b40 = (fdb_kvs_handle *)0x1180a4;
      sprintf(auStack_ac8,"body%d_txn2",(ulong)uVar10);
      pfVar13 = pfStack_b18;
      pfStack_b40 = (fdb_kvs_handle *)0x1180b1;
      sVar4 = strlen(pcVar11);
      pfStack_b40 = (fdb_kvs_handle *)0x1180bc;
      sVar5 = strlen(auStack_ac8);
      pfStack_b40 = (fdb_kvs_handle *)0x1180d0;
      fdb_set_kv(pfVar13,pcVar11,sVar4,auStack_ac8,sVar5);
      uVar10 = uVar10 + 1;
    } while (uVar10 != 10);
    pcVar11 = auStack_ac8 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_b30;
    doc_00 = (fdb_kvs_handle *)&p_Stack_b28;
    pcVar15 = (char *)0x0;
    do {
      pfStack_b40 = (fdb_kvs_handle *)0x118109;
      sprintf(pcVar11,"key%d",pcVar15);
      pfStack_b40 = (fdb_kvs_handle *)0x11811d;
      sprintf(auStack_ac8,"body%d",pcVar15);
      pfVar14 = pfStack_b20;
      pfStack_b40 = (fdb_kvs_handle *)0x11812a;
      sVar4 = strlen(pcVar11);
      pfStack_b40 = (fdb_kvs_handle *)0x11813e;
      fVar3 = fdb_get_kv(pfVar14,pcVar11,sVar4,(void **)handle,(size_t *)doc_00);
      pfVar13 = pfStack_b30;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184a8;
      pfStack_b40 = (fdb_kvs_handle *)0x11815b;
      iVar7 = bcmp(pfStack_b30,auStack_ac8,(size_t)p_Stack_b28);
      if (iVar7 != 0) goto LAB_0011849b;
      pfStack_b40 = (fdb_kvs_handle *)0x11816b;
      fdb_free_block(pfVar13);
      pfStack_b40 = (fdb_kvs_handle *)0x11817f;
      sprintf(pcVar11,"key%d",pcVar15);
      pfStack_b40 = (fdb_kvs_handle *)0x118193;
      sprintf(auStack_ac8,"body%d_txn1",pcVar15);
      pfVar13 = pfStack_b10;
      pfStack_b40 = (fdb_kvs_handle *)0x1181a0;
      sVar4 = strlen(pcVar11);
      pfStack_b40 = (fdb_kvs_handle *)0x1181b4;
      fVar3 = fdb_get_kv(pfVar13,pcVar11,sVar4,(void **)handle,(size_t *)doc_00);
      pfVar14 = pfStack_b30;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184ba;
      pfStack_b40 = (fdb_kvs_handle *)0x1181d1;
      iVar7 = bcmp(pfStack_b30,auStack_ac8,(size_t)p_Stack_b28);
      if (iVar7 != 0) goto LAB_001184ad;
      pfStack_b40 = (fdb_kvs_handle *)0x1181e1;
      fdb_free_block(pfVar14);
      pfStack_b40 = (fdb_kvs_handle *)0x1181f5;
      sprintf(pcVar11,"key%d",pcVar15);
      pfStack_b40 = (fdb_kvs_handle *)0x118209;
      sprintf(auStack_ac8,"body%d_txn2",pcVar15);
      pfVar9 = pfStack_b18;
      pfStack_b40 = (fdb_kvs_handle *)0x118216;
      sVar4 = strlen(pcVar11);
      pfStack_b40 = (fdb_kvs_handle *)0x11822a;
      fVar3 = fdb_get_kv(pfVar9,pcVar11,sVar4,(void **)handle,(size_t *)doc_00);
      pfVar13 = pfStack_b30;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184cc;
      pfStack_b40 = (fdb_kvs_handle *)0x118247;
      iVar7 = bcmp(pfStack_b30,auStack_ac8,(size_t)p_Stack_b28);
      if (iVar7 != 0) goto LAB_001184bf;
      pfStack_b40 = (fdb_kvs_handle *)0x118257;
      fdb_free_block(pfVar13);
      uVar10 = (int)pcVar15 + 1;
      pcVar15 = (char *)(ulong)uVar10;
    } while (uVar10 != 10);
    pfStack_b40 = (fdb_kvs_handle *)0x118270;
    fdb_end_transaction((fdb_file_handle *)phStack_b00,'\0');
    pcVar11 = auStack_ac8 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_b30;
    doc_00 = (fdb_kvs_handle *)&p_Stack_b28;
    pcVar15 = (char *)0x0;
    do {
      pfStack_b40 = (fdb_kvs_handle *)0x11829e;
      sprintf(pcVar11,"key%d",pcVar15);
      pfStack_b40 = (fdb_kvs_handle *)0x1182b2;
      sprintf(auStack_ac8,"body%d_txn1",pcVar15);
      pfVar13 = pfStack_b20;
      pfStack_b40 = (fdb_kvs_handle *)0x1182bf;
      sVar4 = strlen(pcVar11);
      pfStack_b40 = (fdb_kvs_handle *)0x1182d3;
      fVar3 = fdb_get_kv(pfVar13,pcVar11,sVar4,(void **)handle,(size_t *)doc_00);
      pfVar9 = pfStack_b30;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184de;
      pfStack_b40 = (fdb_kvs_handle *)0x1182f0;
      iVar7 = bcmp(pfStack_b30,auStack_ac8,(size_t)p_Stack_b28);
      if (iVar7 != 0) goto LAB_001184d1;
      pfStack_b40 = (fdb_kvs_handle *)0x118300;
      fVar3 = fdb_free_block(pfVar9);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184e3;
      pfStack_b40 = (fdb_kvs_handle *)0x11831c;
      sprintf(pcVar11,"key%d",pcVar15);
      pfStack_b40 = (fdb_kvs_handle *)0x118330;
      sprintf(auStack_ac8,"body%d_txn2",pcVar15);
      pfVar9 = pfStack_b18;
      pfStack_b40 = (fdb_kvs_handle *)0x11833d;
      sVar4 = strlen(pcVar11);
      pfStack_b40 = (fdb_kvs_handle *)0x118351;
      fVar3 = fdb_get_kv(pfVar9,pcVar11,sVar4,(void **)handle,(size_t *)doc_00);
      pfVar14 = pfStack_b30;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184e8;
      pfStack_b40 = (fdb_kvs_handle *)0x11836e;
      iVar7 = bcmp(pfStack_b30,auStack_ac8,(size_t)p_Stack_b28);
      if (iVar7 != 0) goto LAB_001184ed;
      pfStack_b40 = (fdb_kvs_handle *)0x11837e;
      fdb_free_block(pfVar14);
      uVar10 = (int)pcVar15 + 1;
      pcVar15 = (char *)(ulong)uVar10;
    } while (uVar10 != 10);
    pfStack_b40 = (fdb_kvs_handle *)0x118397;
    fdb_end_transaction((fdb_file_handle *)pkStack_b08,'\0');
    pcVar11 = auStack_ac8 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_b30;
    doc_00 = (fdb_kvs_handle *)&p_Stack_b28;
    pfVar14 = (fdb_kvs_handle *)0x0;
    while( true ) {
      pfStack_b40 = (fdb_kvs_handle *)0x1183c3;
      sprintf(pcVar11,"key%d",pfVar14);
      pfStack_b40 = (fdb_kvs_handle *)0x1183d6;
      sprintf(auStack_ac8,"body%d_txn2",pfVar14);
      pfVar13 = pfStack_b20;
      pfStack_b40 = (fdb_kvs_handle *)0x1183e3;
      sVar4 = strlen(pcVar11);
      pfStack_b40 = (fdb_kvs_handle *)0x1183f7;
      pfVar9 = pfVar13;
      fVar3 = fdb_get_kv(pfVar13,pcVar11,sVar4,(void **)handle,(size_t *)doc_00);
      pcVar15 = (char *)pfStack_b30;
      if (fVar3 != FDB_RESULT_SUCCESS) break;
      pfStack_b40 = (fdb_kvs_handle *)0x118414;
      iVar7 = bcmp(pfStack_b30,auStack_ac8,(size_t)p_Stack_b28);
      if (iVar7 != 0) goto LAB_001184fa;
      pfStack_b40 = (fdb_kvs_handle *)0x118424;
      fdb_free_block(pcVar15);
      uVar10 = (int)pfVar14 + 1;
      pfVar14 = (fdb_kvs_handle *)(ulong)uVar10;
      if (uVar10 == 10) {
        pfStack_b40 = (fdb_kvs_handle *)0x118435;
        fdb_close((fdb_file_handle *)phStack_af8);
        pfStack_b40 = (fdb_kvs_handle *)0x11843f;
        fdb_close((fdb_file_handle *)phStack_b00);
        pfStack_b40 = (fdb_kvs_handle *)0x118449;
        fdb_close((fdb_file_handle *)pkStack_b08);
        pfStack_b40 = (fdb_kvs_handle *)0x11844e;
        fdb_shutdown();
        pfStack_b40 = (fdb_kvs_handle *)0x118453;
        memleak_end();
        pcVar11 = "%s PASSED\n";
        if (transaction_simple_api_test()::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        pfStack_b40 = (fdb_kvs_handle *)0x118484;
        fprintf(_stderr,pcVar11,"transaction simple API test");
        return;
      }
    }
LAB_00118507:
    config_00 = (fdb_kvs_config *)(auStack_ac8 + 0x100);
    pcVar15 = auStack_ac8;
    pfStack_b40 = (fdb_kvs_handle *)0x11850c;
    transaction_simple_api_test();
  }
  pfStack_b40 = (fdb_kvs_handle *)in_memory_snapshot_thread;
  transaction_simple_api_test();
  pfStack_b68 = pfVar14;
  pfStack_b60 = (fdb_kvs_handle *)pcVar15;
  pfStack_b58 = handle;
  pfStack_b50 = config_00;
  pfStack_b48 = pfVar13;
  pfStack_b40 = doc_00;
  gettimeofday(&tStack_d80,(__timezone_ptr_t)0x0);
  fVar3 = fdb_snapshot_open(pfVar9,&pfStack_d88,0xffffffffffffffff);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdb6);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdb6,"void *in_memory_snapshot_thread(void *)");
  }
  fVar3 = fdb_iterator_init(pfStack_d88,&pfStack_d98,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdba);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdba,"void *in_memory_snapshot_thread(void *)");
  }
  uVar8 = 0;
  do {
    uVar10 = (uint)uVar8;
    pfStack_d90 = (fdb_doc *)0x0;
    fVar3 = fdb_iterator_get(pfStack_d98,&pfStack_d90);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    sprintf(acStack_c70,"key%d",uVar8);
    sprintf(acStack_d70,"body%d",uVar8);
    doc = pfStack_d90;
    pvVar1 = pfStack_d90->key;
    iVar7 = bcmp(pvVar1,acStack_c70,pfStack_d90->keylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_c70,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc4);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc4,"void *in_memory_snapshot_thread(void *)");
    }
    pvVar1 = doc->body;
    iVar7 = bcmp(pvVar1,acStack_d70,doc->bodylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_d70,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc5);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc5,"void *in_memory_snapshot_thread(void *)");
    }
    uVar10 = uVar10 + 1;
    uVar8 = (ulong)uVar10;
    fdb_doc_free(doc);
    fVar3 = fdb_iterator_next(pfStack_d98);
  } while (fVar3 == FDB_RESULT_SUCCESS);
  if (uVar10 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdc9);
    __assert_fail("i == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdc9,"void *in_memory_snapshot_thread(void *)");
  }
  fVar3 = fdb_iterator_close(pfStack_d98);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdcc);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdcc,"void *in_memory_snapshot_thread(void *)");
  }
  fVar3 = fdb_kvs_close(pfStack_d88);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdce);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdce,"void *in_memory_snapshot_thread(void *)");
  }
  pthread_exit((void *)0x0);
}

Assistant:

void rollback_ncommits()
{

    TEST_INIT();
    memleak_start();

    int r;
    int i, j, n=100;
    int ncommits=10;
    char keybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *kv1, *kv2;
    fdb_kvs_info info;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_status status;
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 0;

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    fdb_kvs_open(dbfile, &kv2, NULL, &kvs_config);


    for(j=0;j<ncommits;++j){

        // set n docs per commit
        for(i=0;i<n;++i){
            sprintf(keybuf, "key%02d%03d", j, i);
            fdb_set_kv(kv1, keybuf, strlen(keybuf), NULL, 0);
            fdb_set_kv(kv2, keybuf, strlen(keybuf), NULL, 0);
        }
        // alternate commit pattern
        if((j % 2) == 0){
            fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        } else {
            fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        }

        // doc_count should match seqnum since they are unique
        fdb_get_kvs_info(kv1, &info);
        TEST_CHK(info.doc_count == info.last_seqnum);
    }

    // iteratively rollback 5 commits
     for(j=ncommits;j>0;--j){
        status = fdb_rollback(&kv1, j*n);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // check rollback doc_count
        fdb_get_kvs_info(kv1, &info);
        TEST_CHK(info.doc_count == info.last_seqnum);
    }

    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();

    TEST_RESULT("rollback n commits");
}